

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicMemAlloc
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst,
          AllocationFunction type)

{
  PSNode *local_48;
  PSNodesSeq local_40;
  initializer_list<dg::pta::PSNode_*> local_20;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (type == REALLOC) {
    createRealloc(&local_40,this,CInst);
  }
  else {
    local_48 = createDynamicAlloc(this,CInst,type);
    local_20._M_len = 1;
    local_20._M_array = &local_48;
    PSNodesSeq::PSNodesSeq(&local_40,&local_20);
  }
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_move_assign
            (&__return_storage_ptr__->_nodes,&local_40);
  __return_storage_ptr__->_repr = local_40._repr;
  if (local_40._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._nodes.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createDynamicMemAlloc(const llvm::CallInst *CInst,
                                               AllocationFunction type) {
    assert(type != AllocationFunction::NONE &&
           "BUG: creating dyn. memory node for NONMEM");

    PSNodesSeq seq;
    if (type == AllocationFunction::REALLOC) {
        seq = createRealloc(CInst);
    } else {
        seq = {createDynamicAlloc(CInst, type)};
    }
    return seq;
}